

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreadpoint.cpp
# Opt level: O3

ssize_t __thiscall LASreadPoint::read(LASreadPoint *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  U32 *pUVar2;
  uint uVar3;
  int iVar4;
  U32 UVar5;
  undefined4 extraout_var;
  I64 *pIVar6;
  undefined4 *puVar7;
  undefined8 unaff_RBP;
  undefined4 in_register_00000034;
  long lVar8;
  ulong uVar9;
  U32 context;
  U32 count;
  undefined4 local_30;
  undefined1 local_2c [4];
  
  lVar8 = CONCAT44(in_register_00000034,__fd);
  local_30 = 0;
  if (this->dec == (ArithmeticDecoder *)0x0) {
    if (this->num_readers != 0) {
      uVar9 = 0;
      do {
        (**this->readers[uVar9]->_vptr_LASreadItem)
                  (this->readers[uVar9],*(undefined8 *)(lVar8 + uVar9 * 8),&local_30);
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->num_readers);
    }
    goto LAB_00131c1a;
  }
  UVar5 = this->chunk_count;
  if (UVar5 == this->chunk_size) {
    if (this->point_start != 0) {
      ArithmeticDecoder::done(this->dec);
      uVar3 = this->current_chunk + 1;
      this->current_chunk = uVar3;
      if (uVar3 < this->tabled_chunks) {
        iVar4 = (*this->instream->_vptr_ByteStreamIn[9])();
        if (this->chunk_starts[this->current_chunk] != CONCAT44(extraout_var,iVar4)) {
          this->current_chunk = this->current_chunk - 1;
          puVar7 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar7 = 0x1267;
          __cxa_throw(puVar7,&int::typeinfo,0);
        }
      }
    }
    init_dec(this);
    uVar3 = this->current_chunk;
    if (uVar3 == this->tabled_chunks) {
      uVar1 = this->number_chunks;
      if (uVar3 < uVar1) {
        pIVar6 = this->chunk_starts;
      }
      else {
        this->number_chunks = uVar1 + 0x100;
        pIVar6 = (I64 *)realloc_las(this->chunk_starts,(ulong)(uVar1 + 0x101) << 3);
        this->chunk_starts = pIVar6;
        uVar3 = this->tabled_chunks;
      }
      pIVar6[uVar3] = this->point_start;
      this->tabled_chunks = uVar3 + 1;
    }
    else {
      pUVar2 = this->chunk_totals;
      if (pUVar2 != (U32 *)0x0) {
        this->chunk_size = pUVar2[uVar3 + 1] - pUVar2[uVar3];
      }
    }
    this->chunk_count = 0;
    UVar5 = 0;
  }
  this->chunk_count = UVar5 + 1;
  if (this->readers != (LASreadItem **)0x0) {
    if (this->num_readers != 0) {
      uVar9 = 0;
      do {
        (**this->readers[uVar9]->_vptr_LASreadItem)
                  (this->readers[uVar9],*(undefined8 *)(lVar8 + uVar9 * 8),&local_30);
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->num_readers);
    }
    goto LAB_00131c1a;
  }
  if (this->num_readers == 0) {
    if (this->layered_las14_compression == false) goto LAB_00131bfe;
LAB_00131b92:
    ArithmeticDecoder::init(this->dec,(EVP_PKEY_CTX *)this->instream);
    (*this->instream->_vptr_ByteStreamIn[3])(this->instream,local_2c);
    if (this->num_readers != 0) {
      uVar9 = 0;
      do {
        (*this->readers_compressed[uVar9]->_vptr_LASreadItem[3])();
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->num_readers);
      if (this->num_readers != 0) {
        uVar9 = 0;
        do {
          (*this->readers_compressed[uVar9]->_vptr_LASreadItem[4])
                    (this->readers_compressed[uVar9],*(undefined8 *)(lVar8 + uVar9 * 8),&local_30);
          uVar9 = uVar9 + 1;
        } while (uVar9 < this->num_readers);
      }
    }
  }
  else {
    uVar9 = 0;
    do {
      (**this->readers_raw[uVar9]->_vptr_LASreadItem)
                (this->readers_raw[uVar9],*(undefined8 *)(lVar8 + uVar9 * 8),&local_30);
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->num_readers);
    if (this->layered_las14_compression != false) goto LAB_00131b92;
    if (this->num_readers != 0) {
      uVar9 = 0;
      do {
        (*this->readers_compressed[uVar9]->_vptr_LASreadItem[4])
                  (this->readers_compressed[uVar9],*(undefined8 *)(lVar8 + uVar9 * 8),&local_30);
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->num_readers);
    }
LAB_00131bfe:
    ArithmeticDecoder::init(this->dec,(EVP_PKEY_CTX *)this->instream);
  }
  this->readers = this->readers_compressed;
LAB_00131c1a:
  return CONCAT71((int7)((ulong)unaff_RBP >> 8),1) & 0xffffffff;
}

Assistant:

BOOL LASreadPoint::read(U8* const * point)
{
  U32 i;
  U32 context = 0;

  try
  {
    if (dec)
    {
      if (chunk_count == chunk_size)
      {
        if (point_start != 0)
        {
          dec->done();
          current_chunk++;
          // check integrity
          if (current_chunk < tabled_chunks)
          {
            I64 here = instream->tell();
            if (chunk_starts[current_chunk] != here)
            {
              // previous chunk was corrupt
              current_chunk--;
              throw 4711;
            }
          }
        }
        init_dec();
        if (current_chunk == tabled_chunks) // no or incomplete chunk table?
        {
          if (current_chunk >= number_chunks)
          {
            number_chunks += 256;
            chunk_starts = (I64*)realloc_las(chunk_starts, sizeof(I64)*(number_chunks+1));
          }
          chunk_starts[tabled_chunks] = point_start; // needs fixing
          tabled_chunks++;
        }
        else if (chunk_totals) // variable sized chunks?
        {
          chunk_size = chunk_totals[current_chunk+1]-chunk_totals[current_chunk];
        }
        chunk_count = 0;
      }
      chunk_count++;

      if (readers)
      {
        for (i = 0; i < num_readers; i++)
        {
          readers[i]->read(point[i], context);
        }
      }
      else
      {
        for (i = 0; i < num_readers; i++)
        {
          readers_raw[i]->read(point[i], context);
        }
        if (layered_las14_compression)
        {
          // for layered compression 'dec' only hands over the stream
          dec->init(instream, FALSE);
          // read how many points are in the chunk
          U32 count;
          instream->get32bitsLE((U8*)&count);
          // read the sizes of all layers
          for (i = 0; i < num_readers; i++)
          {
            ((LASreadItemCompressed*)(readers_compressed[i]))->chunk_sizes();
          }
          for (i = 0; i < num_readers; i++)
          {
            ((LASreadItemCompressed*)(readers_compressed[i]))->init(point[i], context);
          }
          if (DEBUG_OUTPUT_NUM_BYTES_DETAILS) fprintf(stderr, "\n");
        }
        else
        {
          for (i = 0; i < num_readers; i++)
          {
            ((LASreadItemCompressed*)(readers_compressed[i]))->init(point[i], context);
          }
          dec->init(instream);
        }
        readers = readers_compressed;
      }
    }
    else
    {
      for (i = 0; i < num_readers; i++)
      {
        readers[i]->read(point[i], context);
      }
    }
  }
  catch (I32 exception) 
  {
    // create error string
    if (last_error == 0) last_error = new CHAR[128];
    // report error
    if (exception == EOF)
    {
      // end-of-file
      if (dec)
      {
        snprintf(last_error, 128, "end-of-file during chunk with index %u", current_chunk);
      }
      else
      {
        snprintf(last_error, 128, "end-of-file");
      }
    }
    else
    {
      // decompression error
      snprintf(last_error, 128, "chunk with index %u of %u is corrupt", current_chunk, tabled_chunks);
      // if we know where the next chunk starts ...
      if ((current_chunk+1) < tabled_chunks)
      {
        // ... try to seek to the next chunk
        instream->seek(chunk_starts[(current_chunk+1)]);
        // ... ready for next LASreadPoint::read()
        chunk_count = chunk_size;
      }
    }
    return FALSE;
  }
  return TRUE;
}